

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O0

exr_result_t unpack_32bit(exr_decode_pipeline_t *decode)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long *in_RDI;
  int64_t x;
  uint32_t *src;
  exr_coding_channel_info_t *decc;
  int c;
  int64_t y;
  int chans;
  int64_t pixincrement;
  int64_t h;
  int64_t w;
  uint8_t *cdata;
  uint8_t *srcbuffer;
  long local_60;
  undefined4 *local_58;
  int local_44;
  long local_40;
  undefined4 *local_18;
  undefined4 *local_10;
  
  local_10 = (undefined4 *)in_RDI[0xe];
  lVar3 = in_RDI[1];
  iVar1 = *(int *)((long)in_RDI + 0x24);
  for (local_40 = 0; local_40 < iVar1; local_40 = local_40 + 1) {
    for (local_44 = 0; local_44 < (short)lVar3; local_44 = local_44 + 1) {
      lVar4 = *in_RDI + (long)local_44 * 0x30;
      lVar5 = (long)*(int *)(lVar4 + 0xc);
      iVar2 = *(int *)(lVar4 + 0x20);
      local_18 = (undefined4 *)(local_40 * *(int *)(lVar4 + 0x24) + *(long *)(lVar4 + 0x28));
      if ((long)iVar2 == 4) {
        memcpy(local_18,local_10,lVar5 << 2);
      }
      else {
        local_58 = local_10;
        for (local_60 = 0; local_60 < lVar5; local_60 = local_60 + 1) {
          *local_18 = *local_58;
          local_18 = (undefined4 *)((long)iVar2 + (long)local_18);
          local_58 = local_58 + 1;
        }
      }
      local_10 = local_10 + lVar5;
    }
  }
  return 0;
}

Assistant:

static exr_result_t
unpack_32bit (exr_decode_pipeline_t* decode)
{
    /* we know we're unpacking all the channels and there is no subsampling */
    const uint8_t* srcbuffer = (const uint8_t*) decode->unpacked_buffer;
    uint8_t*       cdata;
    int64_t        w, h, pixincrement;
    int            chans = decode->channel_count;

    h = (int64_t) decode->chunk.height;

    for (int64_t y = 0; y < h; ++y)
    {
        for (int c = 0; c < chans; ++c)
        {
            exr_coding_channel_info_t* decc = (decode->channels + c);

            cdata        = decc->decode_to_ptr;
            w            = decc->width;
            pixincrement = decc->user_pixel_stride;
            cdata += y * (int64_t) decc->user_line_stride;
            /* specialize to memcpy if we can */
#if EXR_HOST_IS_NOT_LITTLE_ENDIAN
            if (pixincrement == 4)
            {
                uint32_t*       tmp = (uint32_t*) cdata;
                const uint32_t* src = (const uint32_t*) srcbuffer;
                uint32_t*       end = tmp + w;

                while (tmp < end)
                    *tmp++ = le32toh (*src++);
            }
            else
            {
                const uint32_t* src = (const uint32_t*) srcbuffer;
                for (int64_t x = 0; x < w; ++x)
                {
                    *((uint32_t*) cdata) = le32toh (*src++);
                    cdata += pixincrement;
                }
            }
#else
            if (pixincrement == 4)
            {
                memcpy (cdata, srcbuffer, (size_t) (w) *4);
            }
            else
            {
                const uint32_t* src = (const uint32_t*) srcbuffer;
                for (int64_t x = 0; x < w; ++x)
                {
                    *((uint32_t*) cdata) = *src++;
                    cdata += pixincrement;
                }
            }
#endif
            srcbuffer += w * 4;
        }
    }
    return EXR_ERR_SUCCESS;
}